

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogicOperatorType.cpp
# Opt level: O2

string * __thiscall
IRT::ToString_abi_cxx11_(string *__return_storage_ptr__,IRT *this,LogicOperatorType type)

{
  string *this_00;
  undefined7 in_register_00000011;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_1d;
  allocator<char> local_1c;
  allocator<char> local_1b;
  allocator<char> local_1a;
  allocator<char> local_19;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "LT";
    __a = &local_1b;
    break;
  case 1:
    __s = "GT";
    __a = &local_1a;
    break;
  case 2:
    __s = "EQ";
    __a = &local_1d;
    break;
  case 3:
    __s = "NE";
    __a = &local_1c;
    break;
  default:
    this_00 = (string *)__cxa_allocate_exception(0x20,this,CONCAT71(in_register_00000011,type));
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,"unknown logic operator type",&local_19);
    __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string IRT::ToString(IRT::LogicOperatorType type) {
  switch (type) {
    case LogicOperatorType::EQ:
      return "EQ";
    case LogicOperatorType::NE:
      return "NE";
    case LogicOperatorType::LT:
      return "LT";
    case LogicOperatorType::GT:
      return "GT";
  }
  throw std::string("unknown logic operator type");
}